

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O3

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  ushort uVar1;
  bool bVar2;
  ZSTD_CCtx *pZVar3;
  uint *workspace;
  byte *pbVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  size_t sVar13;
  int iVar14;
  seqDef *psVar15;
  long lVar16;
  size_t __n;
  size_t err_code_3;
  symbolEncodingType_e sVar17;
  size_t err_code_1;
  byte *pbVar18;
  U16 *pUVar19;
  BYTE *pBVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  undefined4 in_register_0000008c;
  U32 *pUVar24;
  size_t nbSeq;
  size_t err_code;
  size_t sourceSize;
  bool bVar25;
  byte bVar26;
  undefined2 in_stack_fffffffffffffd68;
  byte in_stack_fffffffffffffd6b;
  undefined8 local_280;
  U32 local_278 [2];
  byte *local_270;
  BYTE *local_268;
  size_t local_260;
  seqDef *local_258;
  uint local_24c;
  long local_248;
  ZSTD_compressedBlockState_t *local_240;
  byte *local_238;
  size_t local_230;
  BYTE *local_228;
  BYTE *local_220;
  BYTE *local_218;
  ZSTD_CCtx *local_210;
  void *local_208;
  seqDef *local_200;
  FSE_CTable *local_1f8;
  FSE_CTable *local_1f0;
  ZSTD_fseCTables_t *local_1e8;
  uint *countWksp;
  void *local_1d8;
  ZSTD_compressedBlockState_t *local_1d0;
  ulong local_1c8;
  undefined8 local_1c0;
  seqDef *local_1b8;
  size_t local_1b0;
  seqDef *local_1a8;
  size_t local_1a0;
  BYTE *local_198;
  void *local_190;
  U16 *local_188;
  ulong local_180;
  ulong local_178;
  seqDef *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1c0 = CONCAT44(in_register_0000008c,lastBlock);
  pbVar4 = (byte *)ZSTD_buildBlockEntropyStats
                             (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                              &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                              &entropyMetadata,zc->entropyWorkspace,0x19d8);
  if ((byte *)0xffffffffffffff88 < pbVar4) {
    return (size_t)pbVar4;
  }
  local_1d0 = (zc->blockState).prevCBlock;
  local_240 = (zc->blockState).nextCBlock;
  local_1c8 = (ulong)(uint)zc->bmi2;
  countWksp = zc->entropyWorkspace;
  local_1b8 = (zc->seqStore).sequencesStart;
  local_1a8 = (zc->seqStore).sequences;
  pBVar20 = (zc->seqStore).litStart;
  local_198 = (zc->seqStore).lit;
  local_190 = (void *)(srcSize + (long)src);
  local_248 = dstCapacity + (long)dst;
  local_218 = (zc->seqStore).llCode;
  local_220 = (zc->seqStore).mlCode;
  local_228 = (zc->seqStore).ofCode;
  local_1b0 = (zc->appliedParams).targetCBlockSize;
  uVar22 = (uint)(entropyMetadata.hufMetadata.hType == set_compressed);
  local_170 = local_1a8 + -1;
  local_1e8 = &(local_240->entropy).fse;
  local_1f0 = (local_240->entropy).fse.litlengthCTable;
  local_1f8 = (local_240->entropy).fse.matchlengthCTable;
  bVar2 = true;
  psVar15 = local_1b8;
  local_210 = zc;
  local_208 = dst;
  local_1d8 = src;
LAB_001bc6d6:
  local_1a0 = (long)local_198 - (long)pBVar20;
  local_230 = (local_248 - (long)dst) - 3;
  lVar5 = 0;
  if (uVar22 != 0) {
    lVar5 = 200;
  }
  local_270 = (byte *)((long)dst + 3);
  local_178 = 0x400 - lVar5;
  local_180 = 0x4000 - lVar5;
  local_188 = &psVar15->matchLength;
  nbSeq = 0;
  sourceSize = 0;
  local_268 = pBVar20;
  local_258 = psVar15;
  local_238 = (byte *)dst;
  do {
    if (local_1b8 == local_1a8) {
      bVar26 = true;
      sourceSize = local_1a0;
    }
    else {
      psVar15 = local_258 + nbSeq;
      bVar26 = psVar15 == local_170;
      uVar1 = psVar15->litLength;
      uVar21 = (uint)uVar1;
      if ((local_210->seqStore).longLengthPos ==
          (U32)((ulong)((long)psVar15 - (long)(local_210->seqStore).sequencesStart) >> 3)) {
        uVar21 = uVar1 + 0xffff;
        if ((local_210->seqStore).longLengthType != ZSTD_llt_literalLength) {
          uVar21 = (uint)uVar1;
        }
      }
      nbSeq = nbSeq + 1;
      sourceSize = sourceSize + uVar21;
      if ((bool)bVar26) {
        sourceSize = local_1a0;
      }
    }
    local_280 = CONCAT44(local_280._4_4_,0xff);
    sVar13 = sourceSize;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      sVar6 = HIST_count_wksp(countWksp,(uint *)&local_280,local_268,sourceSize,countWksp,0x19d8);
      if (sVar6 < 0xffffffffffffff89) {
        sVar6 = HUF_estimateCompressedSize((HUF_CElt *)local_240,countWksp,(uint)local_280);
        sVar13 = entropyMetadata.hufMetadata.hufDesSize;
        if (uVar22 == 0) {
          sVar13 = 0;
        }
        sVar13 = sVar6 + sVar13 + 3;
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType == set_rle) {
        sVar13 = 1;
      }
      else {
        sVar13 = 0;
      }
    }
    workspace = countWksp;
    if (nbSeq == 0) {
      psVar15 = local_258;
      if (local_1b0 < sVar13 + 6 || (bool)bVar26 != false) {
LAB_001bca01:
        lVar5 = 0;
        goto LAB_001bca04;
      }
    }
    else {
      local_260 = sourceSize;
      sVar7 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.ofType,local_228,0x1f,nbSeq,
                         local_1e8->offcodeCTable,(U32 *)0x0,OF_defaultNorm,5,0x1c,countWksp,
                         CONCAT44(uVar22,CONCAT13(in_stack_fffffffffffffd6b,
                                                  CONCAT12(bVar26,in_stack_fffffffffffffd68))));
      sVar8 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.llType,local_218,0x23,nbSeq,local_1f0,LL_bits,
                         LL_defaultNorm,6,0x23,workspace,
                         CONCAT44(uVar22,CONCAT13(in_stack_fffffffffffffd6b,
                                                  CONCAT12(bVar26,in_stack_fffffffffffffd68))));
      sVar9 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.mlType,local_220,0x34,nbSeq,local_1f8,ML_bits,
                         ML_defaultNorm,6,0x34,workspace,
                         CONCAT44(uVar22,CONCAT13(in_stack_fffffffffffffd6b,
                                                  CONCAT12(bVar26,in_stack_fffffffffffffd68))));
      sVar6 = 0;
      if (bVar2) {
        sVar6 = entropyMetadata.fseMetadata.fseTablesSize;
      }
      sourceSize = local_260;
      if (local_1b0 < sVar6 + sVar8 + sVar9 + sVar13 + sVar7 + 6 || bVar26 != 0) {
        psVar15 = local_258 + nbSeq;
        if ((long)nbSeq < 1) goto LAB_001bca01;
        uVar10 = (long)local_258 - (long)(local_210->seqStore).sequencesStart;
        lVar16 = nbSeq * 8;
        lVar5 = 0;
        pUVar19 = local_188;
        do {
          uVar21 = *pUVar19 + 3;
          if (((local_210->seqStore).longLengthPos == (U32)(uVar10 >> 3)) &&
             ((local_210->seqStore).longLengthType == ZSTD_llt_matchLength)) {
            uVar21 = *pUVar19 + 0x10002;
          }
          lVar5 = lVar5 + (ulong)uVar21;
          uVar10 = uVar10 + 8;
          lVar16 = lVar16 + -8;
          pUVar19 = pUVar19 + 4;
        } while (0 < lVar16);
LAB_001bca04:
        sVar13 = entropyMetadata.hufMetadata.hufDesSize;
        in_stack_fffffffffffffd6b = (int)local_1c0 != 0;
        lVar16 = (ulong)(local_180 <= sourceSize) - (ulong)(sourceSize < local_178);
        sVar17 = set_repeat;
        if (uVar22 != 0) {
          sVar17 = entropyMetadata.hufMetadata.hType;
        }
        local_200 = psVar15;
        if (sourceSize == 0) {
LAB_001bca5c:
          pbVar4 = local_270;
          pbVar11 = (byte *)ZSTD_noCompressLiterals(local_270,local_230,local_268,sourceSize);
LAB_001bca8c:
          uVar10 = CONCAT71((int7)((ulong)pbVar4 >> 8),1);
        }
        else {
          if (entropyMetadata.hufMetadata.hType == set_rle) {
            pbVar4 = local_270;
            pbVar11 = (byte *)ZSTD_compressRleLiteralsBlock
                                        (local_270,local_230,local_268,sourceSize);
            goto LAB_001bca8c;
          }
          if (entropyMetadata.hufMetadata.hType == set_basic) goto LAB_001bca5c;
          pbVar11 = local_270 + lVar16 + 4;
          if (entropyMetadata.hufMetadata.hType == set_compressed && uVar22 != 0) {
            memcpy(pbVar11,entropyMetadata.hufMetadata.hufDesBuffer,
                   entropyMetadata.hufMetadata.hufDesSize);
            local_260 = sVar13;
            pbVar11 = pbVar11 + sVar13;
          }
          else {
            local_260 = 0;
          }
          uVar10 = lVar16 + 4;
          if (uVar10 == 3) {
            sVar13 = HUF_compress1X_usingCTable
                               (pbVar11,local_248 - (long)pbVar11,local_268,sourceSize,
                                (HUF_CElt *)local_240);
          }
          else {
            sVar13 = HUF_compress4X_usingCTable
                               (pbVar11,local_248 - (long)pbVar11,local_268,sourceSize,
                                (HUF_CElt *)local_240);
          }
          if (0xffffffffffffff87 < sVar13 - 1) goto LAB_001bce05;
          uVar23 = local_260 + sVar13;
          if (((uVar22 == 0) && (sourceSize <= uVar23)) ||
             (uVar10 < ((ulong)(0x3ff < uVar23) - (ulong)(uVar23 < 0x4000)) + 4)) goto LAB_001bca5c;
          iVar14 = (int)sourceSize * 0x10;
          uVar21 = (uint)uVar23;
          if (uVar10 == 5) {
            *(symbolEncodingType_e *)(local_238 + 3) = uVar21 * 0x400000 + sVar17 + iVar14 + 0xc;
            local_238[7] = (byte)(uVar21 >> 10);
          }
          else if (uVar10 == 4) {
            *(symbolEncodingType_e *)local_270 = uVar21 * 0x40000 + sVar17 + iVar14 + 8;
          }
          else {
            iVar14 = uVar21 * 0x4000 + sVar17 + iVar14;
            *(short *)(local_238 + 3) = (short)iVar14;
            local_238[5] = (byte)((uint)iVar14 >> 0x10);
          }
          pbVar11 = pbVar11 + (sVar13 - (long)local_270);
          uVar10 = 0;
        }
        if ((byte *)0xffffffffffffff88 < pbVar11) {
          return (size_t)pbVar11;
        }
        if (pbVar11 != (byte *)0x0) {
          pbVar11 = local_270 + (long)pbVar11;
          bVar25 = 0x39 < (local_210->appliedParams).cParams.windowLog;
          if (local_248 - (long)pbVar11 < 4) {
            return (size_t)(byte *)0xffffffffffffffba;
          }
          if (nbSeq < 0x7f) {
            *pbVar11 = (byte)nbSeq;
            if (nbSeq != 0) {
              pbVar4 = pbVar11 + 1;
              goto LAB_001bcb77;
            }
            pbVar18 = (byte *)0x1;
            bVar25 = true;
LAB_001bcdc6:
            dst = pbVar11 + (long)pbVar18;
            pbVar4 = (byte *)((long)dst + -(long)local_238);
            iVar14 = (in_stack_fffffffffffffd6b & bVar26 | 0xffffffec) + (int)pbVar4 * 8;
            *(short *)local_238 = (short)iVar14;
            local_238[2] = (byte)((uint)iVar14 >> 0x10);
            if ((byte *)0xffffffffffffff88 < pbVar4) {
              return (size_t)pbVar4;
            }
            if ((pbVar4 != (byte *)0x0) && (pbVar4 < (byte *)(lVar5 + sourceSize))) break;
          }
          else {
            if (nbSeq < 0x7f00) {
              *pbVar11 = (byte)(nbSeq >> 8) | 0x80;
              pbVar11[1] = (byte)nbSeq;
              pbVar4 = pbVar11 + 2;
            }
            else {
              *pbVar11 = 0xff;
              *(short *)(pbVar11 + 1) = (short)nbSeq + -0x7f00;
              pbVar4 = pbVar11 + 3;
            }
LAB_001bcb77:
            local_24c = (uint)uVar10;
            pbVar18 = pbVar4 + 1;
            if (bVar2) {
              *pbVar4 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                        (char)(entropyMetadata.fseMetadata.llType << 6) +
                        (char)entropyMetadata.fseMetadata.mlType * '\x04';
              local_260 = sourceSize;
              memcpy(pbVar18,entropyMetadata.fseMetadata.fseTablesBuffer,
                     entropyMetadata.fseMetadata.fseTablesSize);
              pbVar18 = pbVar18 + entropyMetadata.fseMetadata.fseTablesSize;
              pbVar12 = (byte *)ZSTD_encodeSequences
                                          (pbVar18,local_248 - (long)pbVar18,local_1f8,local_220,
                                           local_1e8->offcodeCTable,local_228,local_1f0,local_218,
                                           local_258,nbSeq,(uint)bVar25,(int)local_1c8);
              if ((byte *)0xffffffffffffff88 < pbVar12) {
                return (size_t)pbVar12;
              }
              pbVar18 = pbVar18 + (long)pbVar12;
              sourceSize = local_260;
              if ((entropyMetadata.fseMetadata.lastCountSize != 0) &&
                 (pbVar12 + entropyMetadata.fseMetadata.lastCountSize < (byte *)0x4))
              goto LAB_001bce05;
            }
            else {
              *pbVar4 = 0xfc;
              pbVar12 = (byte *)ZSTD_encodeSequences
                                          (pbVar18,local_248 - (long)pbVar18,local_1f8,local_220,
                                           local_1e8->offcodeCTable,local_228,local_1f0,local_218,
                                           local_258,nbSeq,(uint)bVar25,(int)local_1c8);
              if ((byte *)0xffffffffffffff88 < pbVar12) {
                return (size_t)pbVar12;
              }
              pbVar18 = pbVar18 + (long)pbVar12;
            }
            uVar10 = (ulong)local_24c;
            if (3 < (long)pbVar18 - (long)pbVar4) {
              pbVar18 = pbVar18 + -(long)pbVar11;
              if ((byte *)0xffffffffffffff88 < pbVar18) {
                return (size_t)pbVar18;
              }
              if (pbVar18 != (byte *)0x0) {
                bVar25 = false;
                goto LAB_001bcdc6;
              }
            }
          }
        }
      }
    }
LAB_001bce05:
    if (bVar26 != 0) {
      local_200 = local_258;
      dst = local_238;
      goto LAB_001bcf05;
    }
  } while( true );
  local_1d8 = (void *)((long)local_1d8 + (long)(lVar5 + sourceSize));
  pBVar20 = local_268 + sourceSize;
  local_218 = local_218 + nbSeq;
  local_220 = local_220 + nbSeq;
  local_228 = local_228 + nbSeq;
  if ((char)uVar10 == '\0') {
    uVar22 = 0;
  }
  if (!bVar25) {
    bVar2 = false;
  }
  psVar15 = local_200;
  if (bVar26 != 0) {
LAB_001bcf05:
    psVar15 = local_1b8;
    pZVar3 = local_210;
    lVar5 = local_248;
    if (uVar22 != 0) {
      memcpy(local_240,local_1d0,0x404);
    }
    if ((bVar2) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      return (size_t)(byte *)0x0;
    }
    if (local_1d8 < local_190) {
      __n = (long)local_190 - (long)local_1d8;
      pbVar4 = (byte *)(__n + 3);
      if ((byte *)(lVar5 - (long)dst) < pbVar4) {
        return (size_t)(byte *)0xffffffffffffffba;
      }
      iVar14 = (int)local_1c0 + (int)__n * 8;
      *(short *)dst = (short)iVar14;
      *(byte *)((long)dst + 2) = (byte)((uint)iVar14 >> 0x10);
      memcpy((byte *)((long)dst + 3),local_1d8,__n);
      if ((byte *)0xffffffffffffff88 < pbVar4) {
        return (size_t)pbVar4;
      }
      dst = (void *)((long)dst + (long)pbVar4);
      if (local_200 < local_1a8) {
        local_278[0] = local_1d0->rep[2];
        local_280 = *(ulong *)local_1d0->rep;
        if (psVar15 < local_200) {
          uVar10 = (long)psVar15 - (long)(pZVar3->seqStore).sequencesStart;
          do {
            uVar1 = psVar15->litLength;
            uVar22 = (uint)uVar1;
            if (((pZVar3->seqStore).longLengthPos == (U32)(uVar10 >> 3)) &&
               (uVar22 = uVar1 + 0xffff, (pZVar3->seqStore).longLengthType != ZSTD_llt_literalLength
               )) {
              uVar22 = (uint)uVar1;
            }
            uVar21 = psVar15->offset - 1;
            pUVar24 = (U32 *)((long)&local_280 + 4);
            if (uVar21 < 3) {
              uVar21 = uVar21 + (uVar22 == 0);
              if (uVar21 == 0) {
                uVar23 = local_280 >> 0x20;
                pUVar24 = local_278;
              }
              else {
                if (uVar21 == 3) {
                  uVar22 = (uint)local_280 - 1;
                }
                else {
                  uVar22 = local_278[(ulong)uVar21 - 2];
                }
                uVar23 = local_280 & 0xffffffff;
                local_280 = (ulong)uVar22;
                if (uVar21 == 1) {
                  pUVar24 = local_278;
                }
              }
            }
            else {
              uVar23 = local_280 & 0xffffffff;
              local_280 = (ulong)(psVar15->offset - 3);
            }
            local_280 = local_280 & 0xffffffff | uVar23 << 0x20;
            local_278[0] = *pUVar24;
            psVar15 = psVar15 + 1;
            uVar10 = uVar10 + 8;
          } while (psVar15 < local_200);
        }
        local_240->rep[2] = local_278[0];
        *(ulong *)local_240->rep = local_280;
      }
    }
    return (size_t)(byte *)((long)dst + -(long)local_208);
  }
  goto LAB_001bc6d6;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}